

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ctor-eval.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  pointer *ppuVar1;
  int *piVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *__dest;
  _Base_ptr *pp_Var3;
  _Link_type other;
  pointer pcVar4;
  Export *this;
  size_t sVar5;
  size_t sVar6;
  char *pcVar7;
  DataSegment *table;
  _Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_> global;
  _Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_> _Var8;
  uintptr_t uVar9;
  size_t sVar10;
  size_t sVar11;
  Expression *pEVar12;
  undefined1 auVar13 [16];
  _Rb_tree_node_base *p_Var14;
  undefined1 *puVar15;
  pointer puVar16;
  pointer puVar17;
  pointer puVar18;
  _Head_base<0UL,_wasm::Module_*,_false> _Var19;
  pointer puVar20;
  pointer puVar21;
  undefined8 uVar22;
  char cVar23;
  bool bVar24;
  string *psVar25;
  mapped_type *pmVar26;
  Module *pMVar27;
  Function *pFVar28;
  Expression *pEVar29;
  Table *pTVar30;
  Global *pGVar31;
  Const *pCVar32;
  size_t *psVar33;
  element_type *peVar34;
  _Rb_tree_node_base *this_00;
  _Rb_tree_node_base *p_Var35;
  ostream *poVar36;
  char *pcVar37;
  long lVar38;
  Function *function;
  Function *pFVar39;
  ulong uVar40;
  long *plVar41;
  undefined4 *puVar42;
  Expression *value;
  Block *pBVar43;
  pointer pCVar44;
  uintptr_t *puVar45;
  const_iterator cVar46;
  ModuleUtils *this_01;
  const_iterator cVar47;
  long extraout_RDX;
  int iVar48;
  Name *this_02;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg;
  _Link_type p_Var49;
  _Head_base<0UL,_wasm::Module_*,_false> _Var50;
  _Link_type __p;
  Literals *arguments;
  uint uVar51;
  pointer puVar52;
  _Rb_tree_node_base *p_Var53;
  Index *this_03;
  _Base_ptr p_Var54;
  Name newName;
  Name newName_00;
  Name NVar55;
  Name NVar56;
  Name NVar57;
  Name NVar58;
  Name NVar59;
  Name NVar60;
  Name root;
  Name root_00;
  string_view sVar61;
  pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*> pVar62;
  undefined1 auVar63 [16];
  Name NVar64;
  IString IVar65;
  Name name;
  undefined1 local_1250 [8];
  ToolOptions options;
  Module wasm;
  CtorEvalExternalInterface interface;
  CtorEvalExternalInterface envInterface;
  undefined1 auStack_b28 [8];
  __single_object export_;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b18;
  undefined1 local_b08;
  undefined7 uStack_b07;
  _Rb_tree_impl<std::less<wasm::Name>,_true> _Stack_b00;
  pointer local_ad0;
  _Base_ptr local_ac8;
  __uniq_ptr_impl<std::vector<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>,_std::default_delete<std::vector<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>_>_>
  local_ac0;
  _Base_ptr p_Stack_ab8;
  undefined4 local_ab0;
  undefined4 uStack_aac;
  __node_base local_aa8;
  undefined1 auStack_aa0 [48];
  __node_base local_a70;
  element_type eStack_a68;
  float local_a28;
  size_t local_a20;
  CustomSection aCStack_a18 [7];
  _Prime_rehash_policy local_868;
  __node_base_ptr local_858;
  __buckets_ptr local_850;
  size_type local_848;
  __node_base _Stack_840;
  code *local_838;
  code *local_830;
  size_t local_828;
  __node_base_ptr p_Stack_820;
  __buckets_ptr local_818;
  code *local_810;
  undefined1 auStack_808 [8];
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  keptExportsSet;
  undefined1 auStack_7c8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  passes;
  PassOptions ret;
  long *local_6d8 [2];
  long local_6c8 [2];
  long *local_6b8 [2];
  long local_6a8 [2];
  long *local_698 [2];
  long local_688 [2];
  long *local_678 [2];
  long local_668 [2];
  string local_658;
  string local_638;
  string local_618;
  string local_5f8;
  string local_5d8;
  string local_5b8;
  long *local_598 [2];
  long local_588 [2];
  undefined1 local_578 [48];
  _Base_ptr *local_548;
  _Base_ptr p_Stack_540;
  _Base_ptr local_538;
  _Base_ptr p_Stack_530;
  _Base_ptr local_528;
  uchar auStack_520 [16];
  uchar local_510 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_508;
  char *local_500;
  undefined1 auStack_4f8 [8];
  ModuleReader reader;
  undefined1 local_4d8 [16];
  pointer local_4c8;
  HeapType HStack_4c0;
  _Base_ptr local_4b8;
  atomic<MixedArena_*> *local_368 [2];
  atomic<MixedArena_*> local_358 [2];
  __node_base *local_348 [2];
  __node_base local_338 [2];
  _Hash_node_base *local_328 [2];
  _Hash_node_base local_318 [2];
  undefined1 auStack_308 [8];
  FunctionScope scope;
  Split ctors;
  undefined1 auStack_2a8 [8];
  Split keptExports;
  _Storage<wasm::Literals,_false> local_288;
  char local_250;
  __node_base local_248 [2];
  undefined1 local_238 [16];
  __node_base _Stack_228;
  shared_ptr<(anonymous_namespace)::EvallingModuleRunner> envInstance;
  undefined1 auStack_208 [8];
  Literals params;
  undefined1 auStack_1c8 [8];
  Literals results;
  size_type *local_188;
  string WasmCtorEvalOption;
  vector<wasm::Literals,_std::allocator<wasm::Literals>_> appliedLocals;
  __node_base local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> input;
  _Head_base<0UL,_wasm::Module_*,_false> local_118;
  unique_ptr<wasm::Module,_std::default_delete<wasm::Module>_> envModule;
  undefined1 local_108 [16];
  undefined1 auStack_f8 [8];
  Builder builder_1;
  pointer local_e8;
  undefined1 auStack_d8 [8];
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> localSets;
  pointer local_b8;
  pointer pLStack_b0;
  Function *local_a8;
  _Base_ptr local_a0;
  _Base_ptr p_Stack_98;
  _Rb_tree_header *local_88;
  map<wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
  linkedInstances;
  undefined1 local_3a;
  undefined1 local_39 [7];
  bool emitBinary;
  bool debugInfo;
  
  auStack_7c8 = (undefined1  [8])0x0;
  passes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  passes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3a = 1;
  local_39[0] = 0;
  scope.currDelegateTarget.super_IString.str._M_str = (char *)0x0;
  keptExports.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  auStack_2a8 = (undefined1  [8])0x0;
  keptExports.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_188 = &WasmCtorEvalOption._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"wasm-ctor-eval options","");
  ppuVar1 = &wasm.exports.
             super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  options._352_8_ = ppuVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&options.enabledFeatures,"wasm-ctor-eval","");
  auStack_b28 = (undefined1  [8])&local_b18;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)auStack_b28,"Execute code at compile time","");
  ::wasm::ToolOptions::ToolOptions
            ((ToolOptions *)local_1250,(string *)&options.enabledFeatures,(string *)auStack_b28);
  if (auStack_b28 != (undefined1  [8])&local_b18) {
    operator_delete((void *)auStack_b28,(ulong)(local_b18._M_allocated_capacity + 1));
  }
  if ((pointer *)options._352_8_ != ppuVar1) {
    operator_delete((void *)options._352_8_,
                    (ulong)((long)&((wasm.exports.
                                     super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish)->_M_t).
                                   super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>
                                   .super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl + 1));
  }
  options._352_8_ = ppuVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&options.enabledFeatures,"--output","");
  auStack_b28 = (undefined1  [8])&local_b18;
  std::__cxx11::string::_M_construct<char_const*>((string *)auStack_b28,"-o","");
  auStack_4f8 = (undefined1  [8])&reader.skipFunctionBodies;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)auStack_4f8,"Output file (stdout if not specified)","");
  interface.seenDataStack.
  super_SmallSetBase<wasm::GCData_*,_2UL,_wasm::OrderedFixedStorage<wasm::GCData_*,_2UL>,_std::set<wasm::GCData_*,_std::less<wasm::GCData_*>,_std::allocator<wasm::GCData_*>_>_>
  .flexible._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  envInterface.super_ExternalInterface._vptr_ExternalInterface = (_func_int **)0x0;
  envInterface.instance =
       (EvallingModuleRunner *)
       std::
       _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-ctor-eval.cpp:986:10)>
       ::_M_invoke;
  envInterface.wasm =
       (Module *)
       std::
       _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-ctor-eval.cpp:986:10)>
       ::_M_manager;
  psVar25 = (string *)
            ::wasm::Options::add
                      ((string *)local_1250,(string *)&options.enabledFeatures,(string *)auStack_b28
                       ,(string *)auStack_4f8,(Arguments)&local_188,(function *)0x1,
                       (bool)((char)&interface + '0'));
  wasm.tagsMap._M_h._M_single_bucket = (__node_base_ptr)&interface.wasm;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&wasm.tagsMap._M_h._M_single_bucket,"--emit-text","");
  piVar2 = &ret.shrinkLevel;
  passes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_2_ = SUB82(piVar2,0);
  passes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._2_1_ = (undefined1)((ulong)piVar2 >> 0x10);
  passes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ = (undefined1)((ulong)piVar2 >> 0x18);
  passes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = (undefined4)((ulong)piVar2 >> 0x20);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)
             &passes.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,"-S","");
  auStack_d8 = (undefined1  [8])
               &localSets.
                super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)auStack_d8,"Emit text instead of binary for the output file","");
  scope.locals.super__Vector_base<wasm::Literals,_std::allocator<wasm::Literals>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  auStack_308 = (undefined1  [8])&local_3a;
  scope.locals.super__Vector_base<wasm::Literals,_std::allocator<wasm::Literals>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)std::
                _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-ctor-eval.cpp:995:10)>
                ::_M_invoke;
  scope.locals.super__Vector_base<wasm::Literals,_std::allocator<wasm::Literals>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)std::
                _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-ctor-eval.cpp:995:10)>
                ::_M_manager;
  psVar25 = (string *)
            ::wasm::Options::add
                      (psVar25,(string *)&wasm.tagsMap._M_h._M_single_bucket,
                       (string *)
                       &passes.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)auStack_d8,
                       (Arguments)&local_188,(function *)0x0,SUB81(auStack_308,0));
  local_288._M_value.super_SmallVector<wasm::Literal,_1UL>.usedFixed =
       (long)&local_288._M_value.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0 + 8
  ;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,"--debuginfo","");
  auStack_208 = (undefined1  [8])&params.super_SmallVector<wasm::Literal,_1UL>.fixed;
  std::__cxx11::string::_M_construct<char_const*>((string *)auStack_208,"-g","");
  auStack_1c8 = (undefined1  [8])&results.super_SmallVector<wasm::Literal,_1UL>.fixed;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)auStack_1c8,"Emit names section and debug info","");
  keptExportsSet._M_h._M_buckets = (__buckets_ptr)0x0;
  auStack_808 = (undefined1  [8])local_39;
  keptExportsSet._M_h._M_before_begin._M_nxt =
       (_Hash_node_base *)
       std::
       _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-ctor-eval.cpp:1001:10)>
       ::_M_invoke;
  keptExportsSet._M_h._M_bucket_count =
       (size_type)
       std::
       _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-ctor-eval.cpp:1001:10)>
       ::_M_manager;
  psVar25 = (string *)
            ::wasm::Options::add
                      (psVar25,(string *)&local_288._M_value,(string *)auStack_208,
                       (string *)auStack_1c8,(Arguments)&local_188,(function *)0x0,
                       SUB81(auStack_808,0));
  local_88 = &linkedInstances._M_t._M_impl.super__Rb_tree_header;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"--ctors","");
  local_548 = &local_538;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_548,"-c","");
  local_578._0_8_ = local_578 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_578,"Comma-separated list of global constructor functions to evaluate",
             "");
  ret.funcEffectsMap.
  super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       &scope.currDelegateTarget.super_IString.str._M_str;
  psVar25 = (string *)
            ::wasm::Options::add
                      (psVar25,(string *)&local_88,(string *)&local_548,(string *)local_578,
                       (Arguments)&local_188,(function *)0x1,(bool)((char)&ret + -0x60));
  local_148._M_nxt = (_Hash_node_base *)&input._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"--kept-exports","");
  auStack_f8 = (undefined1  [8])&stack0xffffffffffffff18;
  std::__cxx11::string::_M_construct<char_const*>((string *)auStack_f8,"-ke","");
  WasmCtorEvalOption.field_2._8_8_ =
       &appliedLocals.super__Vector_base<wasm::Literals,_std::allocator<wasm::Literals>_>._M_impl.
        super__Vector_impl_data._M_finish;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&WasmCtorEvalOption.field_2 + 8),
             "Comma-separated list of ctors whose exports we keep around even if we eval those ctors"
             ,"");
  envInstance.
  super___shared_ptr<(anonymous_namespace)::EvallingModuleRunner,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  _Stack_228._M_nxt = (_Hash_node_base *)auStack_2a8;
  envInstance.
  super___shared_ptr<(anonymous_namespace)::EvallingModuleRunner,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       std::
       _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-ctor-eval.cpp:1017:7)>
       ::_M_manager;
  psVar25 = (string *)
            ::wasm::Options::add
                      (psVar25,(string *)&local_148,(string *)auStack_f8,
                       (string *)(WasmCtorEvalOption.field_2._M_local_buf + 8),(Arguments)&local_188
                       ,(function *)0x1,SUB81(&_Stack_228,0));
  local_248[0]._M_nxt = (_Hash_node_base *)local_238;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_248,"--ignore-external-input","");
  local_118._M_head_impl = (Module *)local_108;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"-ipi","");
  local_368[0] = local_358;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_368,"Assumes no env vars are to be read, stdin is empty, etc.","");
  local_868._M_max_load_factor = 0.0;
  local_868._4_4_ = 0;
  local_868._M_next_resize = 0;
  local_850 = (__buckets_ptr)
              std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-ctor-eval.cpp:1025:10)>
              ::_M_invoke;
  local_858 = (__node_base_ptr)
              std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-ctor-eval.cpp:1025:10)>
              ::_M_manager;
  psVar25 = (string *)
            ::wasm::Options::add
                      (psVar25,(string *)local_248,(string *)&local_118,(string *)local_368,
                       (Arguments)&local_188,(function *)0x0,SUB81(&local_868,0));
  local_348[0] = local_338;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_348,"--quiet","");
  local_6d8[0] = local_6c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_6d8,"-q","");
  local_328[0] = local_318;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_328,"Do not emit verbose logging about the eval process","");
  local_848 = 0;
  _Stack_840._M_nxt = (_Hash_node_base *)0x0;
  local_830 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-ctor-eval.cpp:1033:10)>
              ::_M_invoke;
  local_838 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-ctor-eval.cpp:1033:10)>
              ::_M_manager;
  psVar25 = (string *)
            ::wasm::Options::add
                      (psVar25,(string *)local_348,(string *)local_6d8,(string *)local_328,
                       (Arguments)&local_188,(function *)0x0,SUB81(&local_848,0));
  local_6b8[0] = local_6a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_6b8,"INFILE","");
  local_828 = 0;
  p_Stack_820 = (__node_base_ptr)0x0;
  local_810 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-ctor-eval.cpp:1036:21)>
              ::_M_invoke;
  local_818 = (__buckets_ptr)
              std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-ctor-eval.cpp:1036:21)>
              ::_M_manager;
  ::wasm::Options::add_positional(psVar25,(Arguments)local_6b8,(function *)0x1);
  if (local_818 != (__buckets_ptr)0x0) {
    (*(code *)local_818)(&local_828,&local_828,3);
  }
  if (local_6b8[0] != local_6a8) {
    operator_delete(local_6b8[0],local_6a8[0] + 1);
  }
  if (local_838 != (code *)0x0) {
    (*local_838)(&local_848,&local_848,3);
  }
  if (local_328[0] != local_318) {
    operator_delete(local_328[0],(ulong)((long)&(local_318[0]._M_nxt)->_M_nxt + 1));
  }
  ppuVar1 = &wasm.exports.
             super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (local_6d8[0] != local_6c8) {
    operator_delete(local_6d8[0],local_6c8[0] + 1);
  }
  if (local_348[0] != local_338) {
    operator_delete(local_348[0],(ulong)((long)&(local_338[0]._M_nxt)->_M_nxt + 1));
  }
  if (local_858 != (__node_base_ptr)0x0) {
    (*(code *)local_858)(&local_868,&local_868,3);
  }
  if (local_368[0] != local_358) {
    operator_delete(local_368[0],(ulong)((long)local_358[0]._M_b._M_p + 1));
  }
  if (local_118._M_head_impl != (Module *)local_108) {
    operator_delete(local_118._M_head_impl,
                    (ulong)((long)&(((__uniq_ptr_data<wasm::Export,_std::default_delete<wasm::Export>,_true,_true>
                                      *)local_108._0_8_)->
                                   super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>
                                   )._M_t.
                                   super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>
                                   .super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl + 1));
  }
  if ((LocalSet *)local_248[0]._M_nxt != (LocalSet *)local_238) {
    operator_delete(local_248[0]._M_nxt,local_238._0_8_ + 1);
  }
  if (envInstance.
      super___shared_ptr<(anonymous_namespace)::EvallingModuleRunner,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    (*(code *)envInstance.
              super___shared_ptr<(anonymous_namespace)::EvallingModuleRunner,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi)(&_Stack_228,&_Stack_228,3);
  }
  if ((pointer *)WasmCtorEvalOption.field_2._8_8_ !=
      &appliedLocals.super__Vector_base<wasm::Literals,_std::allocator<wasm::Literals>_>._M_impl.
       super__Vector_impl_data._M_finish) {
    operator_delete((void *)WasmCtorEvalOption.field_2._8_8_,
                    (ulong)((long)&((appliedLocals.
                                     super__Vector_base<wasm::Literals,_std::allocator<wasm::Literals>_>
                                     ._M_impl.super__Vector_impl_data._M_finish)->
                                   super_SmallVector<wasm::Literal,_1UL>).usedFixed + 1));
  }
  if (auStack_f8 != (undefined1  [8])&stack0xffffffffffffff18) {
    operator_delete((void *)auStack_f8,(ulong)((long)&local_e8->field_0 + 1));
  }
  if (local_148._M_nxt != (_Hash_node_base *)&input._M_string_length) {
    operator_delete(local_148._M_nxt,input._M_string_length + 1);
  }
  __dest = &ret.funcEffectsMap.
            super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount;
  std::
  _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-ctor-eval.cpp:1007:10)>
  ::_M_manager((_Any_data *)__dest,(_Any_data *)__dest,__destroy_functor);
  if ((undefined1 *)local_578._0_8_ != local_578 + 0x10) {
    operator_delete((void *)local_578._0_8_,
                    (ulong)&((_Rb_tree_impl<std::less<wasm::Name>,_true> *)local_578._16_8_)->
                            field_0x1);
  }
  if (local_548 != &local_538) {
    operator_delete(local_548,
                    (ulong)&((_Rb_tree_impl<std::less<wasm::Name>,_true> *)&local_538->_M_color)->
                            field_0x1);
  }
  if (local_88 != &linkedInstances._M_t._M_impl.super__Rb_tree_header) {
    operator_delete(local_88,linkedInstances._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ + 1)
    ;
  }
  if (keptExportsSet._M_h._M_bucket_count != 0) {
    (*(code *)keptExportsSet._M_h._M_bucket_count)(auStack_808,auStack_808,3);
  }
  if (auStack_1c8 != (undefined1  [8])&results.super_SmallVector<wasm::Literal,_1UL>.fixed) {
    operator_delete((void *)auStack_1c8,
                    results.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.i64 + 1)
    ;
  }
  if (auStack_208 != (undefined1  [8])&params.super_SmallVector<wasm::Literal,_1UL>.fixed) {
    operator_delete((void *)auStack_208,
                    params.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.i64 + 1);
  }
  if ((undefined1 *)local_288._M_value.super_SmallVector<wasm::Literal,_1UL>.usedFixed !=
      (undefined1 *)
      ((long)&local_288._M_value.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0 + 8
      )) {
    operator_delete((void *)local_288._M_value.super_SmallVector<wasm::Literal,_1UL>.usedFixed,
                    local_288._16_8_ + 1);
  }
  if (scope.locals.super__Vector_base<wasm::Literals,_std::allocator<wasm::Literals>_>._M_impl.
      super__Vector_impl_data._M_finish != (pointer)0x0) {
    (*(code *)scope.locals.super__Vector_base<wasm::Literals,_std::allocator<wasm::Literals>_>.
              _M_impl.super__Vector_impl_data._M_finish)(auStack_308,auStack_308,3);
  }
  if (auStack_d8 !=
      (undefined1  [8])
      &localSets.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl
       .super__Vector_impl_data._M_finish) {
    operator_delete((void *)auStack_d8,
                    (long)localSets.
                          super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish + 1);
  }
  puVar15 = (undefined1 *)
            CONCAT44(passes.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                     CONCAT13(passes.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_,
                              CONCAT12(passes.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage._2_1_,
                                       passes.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage._0_2_)));
  if ((int *)puVar15 != &ret.shrinkLevel) {
    operator_delete(puVar15,CONCAT44(ret.inlining.alwaysInlineMaxSize,ret.shrinkLevel) + 1);
  }
  if (wasm.tagsMap._M_h._M_single_bucket != (__node_base_ptr)&interface.wasm) {
    operator_delete(wasm.tagsMap._M_h._M_single_bucket,
                    (ulong)((long)&((interface.wasm)->exports).
                                   super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + 1));
  }
  if (envInterface.wasm != (Module *)0x0) {
    psVar33 = (size_t *)
              ((long)&interface.seenDataStack.
                      super_SmallSetBase<wasm::GCData_*,_2UL,_wasm::OrderedFixedStorage<wasm::GCData_*,_2UL>,_std::set<wasm::GCData_*,_std::less<wasm::GCData_*>,_std::allocator<wasm::GCData_*>_>_>
                      .flexible._M_t._M_impl.super__Rb_tree_header + 0x20);
    (*(code *)envInterface.wasm)(psVar33,psVar33,3);
  }
  if (auStack_4f8 != (undefined1  [8])&reader.skipFunctionBodies) {
    operator_delete((void *)auStack_4f8,(ulong)((char *)stack0xfffffffffffffb18 + 1));
  }
  if (auStack_b28 != (undefined1  [8])&local_b18) {
    operator_delete((void *)auStack_b28,(ulong)(local_b18._M_allocated_capacity + 1));
  }
  if ((pointer *)options._352_8_ != ppuVar1) {
    operator_delete((void *)options._352_8_,
                    (ulong)((long)&((wasm.exports.
                                     super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish)->_M_t).
                                   super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>
                                   .super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl + 1));
  }
  ::wasm::Options::parse((int)local_1250,(char **)(ulong)(uint)argc);
  options._352_8_ = ppuVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&options.enabledFeatures,"infile","");
  pmVar26 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&options,(key_type *)&options.enabledFeatures);
  ::wasm::read_file<std::__cxx11::string>((string *)&local_148,(BinaryOption)pmVar26);
  if ((pointer *)options._352_8_ != ppuVar1) {
    operator_delete((void *)options._352_8_,
                    (ulong)((long)&((wasm.exports.
                                     super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish)->_M_t).
                                   super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>
                                   .super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl + 1));
  }
  ::wasm::Module::Module((Module *)&options.enabledFeatures);
  ::wasm::ToolOptions::applyFeatures((ToolOptions *)local_1250,(Module *)&options.enabledFeatures);
  if (local_1250[0] == (Options)0x1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"reading...\n",0xb);
  }
  auStack_4f8._2_6_ = auStack_4f8._2_6_ & 0xffff;
  reader._0_8_ = reader._0_8_ & 0xffffffffffffff00;
  auStack_4f8._0_2_ = 1;
  auStack_b28 = (undefined1  [8])&local_b18;
  std::__cxx11::string::_M_construct<char_const*>((string *)auStack_b28,"infile","");
  pmVar26 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&options,(key_type *)auStack_b28);
  pcVar4 = (pmVar26->_M_dataplus)._M_p;
  local_698[0] = local_688;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_698,pcVar4,pcVar4 + pmVar26->_M_string_length);
  local_678[0] = local_668;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_678,"");
  ::wasm::ModuleReader::read(auStack_4f8,local_698,&options.enabledFeatures,local_678);
  if (local_678[0] != local_668) {
    operator_delete(local_678[0],local_668[0] + 1);
  }
  if (local_698[0] != local_688) {
    operator_delete(local_698[0],local_688[0] + 1);
  }
  if (auStack_b28 != (undefined1  [8])&local_b18) {
    operator_delete((void *)auStack_b28,(ulong)(local_b18._M_allocated_capacity + 1));
  }
  cVar23 = ::wasm::WasmValidator::validate((Module *)auStack_b28,(int)&options + 0x160);
  if (cVar23 == '\0') {
    poVar36 = (ostream *)std::operator<<((ostream *)&std::cout,(Module *)&options.enabledFeatures);
    auStack_b28[0] = 10;
    std::__ostream_insert<char,std::char_traits<char>>(poVar36,auStack_b28,1);
    ::wasm::Fatal::Fatal((Fatal *)auStack_b28);
    ::wasm::Fatal::operator<<((Fatal *)auStack_b28,(char (*) [26])"error in validating input");
    goto LAB_0011c306;
  }
  cVar23 = ::wasm::MemoryUtils::flatten((Module *)&options.enabledFeatures);
  if (cVar23 == '\0') {
    if ((anonymous_namespace)::quiet == 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"  ...stopping since could not flatten memory\n",0x2d);
    }
    goto LAB_0011b690;
  }
  arguments = (Literals *)auStack_b28;
  std::
  _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  ::
  _Hashtable<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              *)auStack_808,auStack_2a8,
             keptExports.
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,0,arguments,auStack_4f8,
             (size_t *)
             ((long)&interface.seenDataStack.
                     super_SmallSetBase<wasm::GCData_*,_2UL,_wasm::OrderedFixedStorage<wasm::GCData_*,_2UL>,_std::set<wasm::GCData_*,_std::less<wasm::GCData_*>,_std::allocator<wasm::GCData_*>_>_>
                     .flexible._M_t._M_impl.super__Rb_tree_header + 0x20));
  linkedInstances._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)&linkedInstances;
  linkedInstances._M_t._M_impl._0_4_ = 0;
  linkedInstances._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  linkedInstances._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  linkedInstances._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  linkedInstances._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       linkedInstances._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  pMVar27 = (Module *)operator_new(0x348);
  memset(pMVar27,0,0x348);
  ::wasm::Module::Module(pMVar27);
  local_118._M_head_impl = pMVar27;
  sVar61 = (string_view)::wasm::IString::interned(3,"env",0);
  (pMVar27->name).super_IString.str = sVar61;
  puVar16 = (pointer)wasm.globals.
                     super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
  puVar17 = wasm.dataSegments.
            super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage;
  _Var50._M_head_impl = local_118._M_head_impl;
  if (wasm.exports.
      super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage !=
      (pointer)wasm.functions.
               super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start) {
    linkedInstances._M_t._M_impl.super__Rb_tree_header._M_node_count =
         (size_t)wasm.functions.
                 super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
    puVar52 = wasm.exports.
              super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
    do {
      this = (puVar52->_M_t).super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>
             ._M_t.super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
             super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl;
      if ((*(char **)&this->kind != (char *)0x0) &&
         (*(char **)&this->kind == (pMVar27->name).super_IString.str._M_str)) {
        auVar63._8_8_ = 0;
        auVar63._0_8_ = arguments;
        pFVar28 = ::wasm::ModuleUtils::copyFunction
                            ((ModuleUtils *)this,(Function *)pMVar27,(Module *)0x0,
                             (Name)(auVar63 << 0x40));
        (pFVar28->super_Importable).base.super_IString.str._M_len = 0;
        (pFVar28->super_Importable).base.super_IString.str._M_str = (char *)0x0;
        (pFVar28->super_Importable).module.super_IString.str._M_len = 0;
        (pFVar28->super_Importable).module.super_IString.str._M_str = (char *)0x0;
        pEVar29 = (Expression *)MixedArena::allocSpace(&pMVar27->allocator,0x10,8);
        pEVar29->_id = UnreachableId;
        (pEVar29->type).id = 1;
        pFVar28->body = pEVar29;
        sVar5 = *(size_t *)&this[1].name.super_IString;
        pcVar37 = *(char **)((long)&this[1].name.super_IString + 8);
        sVar6 = (pFVar28->super_Importable).super_Named.name.super_IString.str._M_len;
        pcVar7 = (pFVar28->super_Importable).super_Named.name.super_IString.str._M_str;
        auStack_b28 = (undefined1  [8])operator_new(0x28);
        *(size_t *)((long)auStack_b28 + 0x10) = 0;
        *(size_t *)((long)auStack_b28 + 0x18) = 0;
        *(size_t *)auStack_b28 = 0;
        *(size_t *)((long)auStack_b28 + 8) = 0;
        *(size_t *)((long)auStack_b28 + 0x20) = 0;
        *(size_t *)auStack_b28 = sVar5;
        *(char **)((long)auStack_b28 + 8) = pcVar37;
        *(size_t *)((long)auStack_b28 + 0x10) = sVar6;
        *(char **)((long)auStack_b28 + 0x18) = pcVar7;
        *(undefined4 *)((long)auStack_b28 + 0x20) = 0;
        ::wasm::Module::addExport((unique_ptr *)pMVar27);
        wasm.functions.
        super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)linkedInstances._M_t._M_impl.super__Rb_tree_header._M_node_count;
        if (auStack_b28 != (undefined1  [8])0x0) {
          operator_delete((void *)auStack_b28,0x28);
        }
      }
      puVar52 = puVar52 + 1;
      puVar16 = (pointer)wasm.globals.
                         super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
      puVar17 = wasm.dataSegments.
                super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
      _Var50._M_head_impl = local_118._M_head_impl;
    } while (puVar52 !=
             (pointer)wasm.functions.
                      super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
  }
  for (; puVar18 = (pointer)wasm.memories.
                            super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,
      _Var19._M_head_impl = _Var50._M_head_impl,
      puVar20 = wasm.functions.
                super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,
      puVar17 !=
      (pointer)wasm.tables.
               super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start; puVar17 = puVar17 + 1) {
    table = (puVar17->_M_t).
            super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>._M_t.
            super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>.
            super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl;
    pcVar37 = *(char **)((long)&(table->memory).super_IString + 8);
    wasm.globals.
    super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)puVar16;
    local_118._M_head_impl = _Var50._M_head_impl;
    if ((pcVar37 != (char *)0x0) && (pcVar37 == (pMVar27->name).super_IString.str._M_str)) {
      pTVar30 = ::wasm::ModuleUtils::copyTable((Table *)table,pMVar27);
      (pTVar30->super_Importable).base.super_IString.str._M_len = 0;
      (pTVar30->super_Importable).base.super_IString.str._M_str = (char *)0x0;
      (pTVar30->super_Importable).module.super_IString.str._M_len = 0;
      (pTVar30->super_Importable).module.super_IString.str._M_str = (char *)0x0;
      sVar5 = (((Name *)&table->isPassive)->super_IString).str._M_len;
      pEVar29 = table->offset;
      sVar6 = (pTVar30->super_Importable).super_Named.name.super_IString.str._M_len;
      pcVar37 = (pTVar30->super_Importable).super_Named.name.super_IString.str._M_str;
      auStack_b28 = (undefined1  [8])operator_new(0x28);
      *(size_t *)((long)auStack_b28 + 0x10) = 0;
      *(size_t *)((long)auStack_b28 + 0x18) = 0;
      *(size_t *)auStack_b28 = 0;
      *(size_t *)((long)auStack_b28 + 8) = 0;
      *(size_t *)((long)auStack_b28 + 0x20) = 0;
      *(size_t *)auStack_b28 = sVar5;
      *(Expression **)((long)auStack_b28 + 8) = pEVar29;
      *(size_t *)((long)auStack_b28 + 0x10) = sVar6;
      *(char **)((long)auStack_b28 + 0x18) = pcVar37;
      *(undefined4 *)((long)auStack_b28 + 0x20) = 1;
      ::wasm::Module::addExport((unique_ptr *)pMVar27);
      if (auStack_b28 != (undefined1  [8])0x0) {
        operator_delete((void *)auStack_b28,0x28);
      }
    }
    puVar16 = (pointer)wasm.globals.
                       super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
    _Var50._M_head_impl = local_118._M_head_impl;
  }
  for (; local_118._M_head_impl = _Var19._M_head_impl,
      puVar21 = wasm.elementSegments.
                super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage, puVar20 != puVar16;
      puVar20 = puVar20 + 1) {
    global.super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl =
         (puVar20->_M_t).super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
         ._M_t.super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
         super__Head_base<0UL,_wasm::Function_*,_false>;
    wasm.memories.
    super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)puVar18;
    if ((*(char **)((long)global.super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl + 0x20)
         != (char *)0x0) &&
       (*(char **)((long)global.super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl + 0x20)
        == ((_Var50._M_head_impl)->name).super_IString.str._M_str)) {
      pGVar31 = ::wasm::ModuleUtils::copyGlobal
                          ((Global *)
                           global.super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl,
                           _Var50._M_head_impl);
      (pGVar31->super_Importable).base.super_IString.str._M_len = 0;
      (pGVar31->super_Importable).base.super_IString.str._M_str = (char *)0x0;
      (pGVar31->super_Importable).module.super_IString.str._M_len = 0;
      (pGVar31->super_Importable).module.super_IString.str._M_str = (char *)0x0;
      auStack_4f8 = (undefined1  [8])_Var50._M_head_impl;
      ::wasm::Literal::makeZero((Type)auStack_b28);
      pCVar32 = ::wasm::Builder::makeConst((Builder *)auStack_4f8,(Literal *)auStack_b28);
      pGVar31->init = (Expression *)pCVar32;
      ::wasm::Literal::~Literal((Literal *)auStack_b28);
      sVar5 = (((Name *)((long)global.super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl +
                        0x28))->super_IString).str._M_len;
      pcVar37 = *(char **)((long)global.super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl
                          + 0x30);
      sVar6 = (pGVar31->super_Importable).super_Named.name.super_IString.str._M_len;
      pcVar7 = (pGVar31->super_Importable).super_Named.name.super_IString.str._M_str;
      interface.seenDataStack.
      super_SmallSetBase<wasm::GCData_*,_2UL,_wasm::OrderedFixedStorage<wasm::GCData_*,_2UL>,_std::set<wasm::GCData_*,_std::less<wasm::GCData_*>,_std::allocator<wasm::GCData_*>_>_>
      .flexible._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)operator_new(0x28);
      *(size_t *)
       (interface.seenDataStack.
        super_SmallSetBase<wasm::GCData_*,_2UL,_wasm::OrderedFixedStorage<wasm::GCData_*,_2UL>,_std::set<wasm::GCData_*,_std::less<wasm::GCData_*>,_std::allocator<wasm::GCData_*>_>_>
        .flexible._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x10) = 0;
      *(size_t *)
       (interface.seenDataStack.
        super_SmallSetBase<wasm::GCData_*,_2UL,_wasm::OrderedFixedStorage<wasm::GCData_*,_2UL>,_std::set<wasm::GCData_*,_std::less<wasm::GCData_*>,_std::allocator<wasm::GCData_*>_>_>
        .flexible._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x18) = 0;
      *(size_t *)
       interface.seenDataStack.
       super_SmallSetBase<wasm::GCData_*,_2UL,_wasm::OrderedFixedStorage<wasm::GCData_*,_2UL>,_std::set<wasm::GCData_*,_std::less<wasm::GCData_*>,_std::allocator<wasm::GCData_*>_>_>
       .flexible._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      *(size_t *)
       (interface.seenDataStack.
        super_SmallSetBase<wasm::GCData_*,_2UL,_wasm::OrderedFixedStorage<wasm::GCData_*,_2UL>,_std::set<wasm::GCData_*,_std::less<wasm::GCData_*>,_std::allocator<wasm::GCData_*>_>_>
        .flexible._M_t._M_impl.super__Rb_tree_header._M_node_count + 8) = 0;
      *(size_t *)
       (interface.seenDataStack.
        super_SmallSetBase<wasm::GCData_*,_2UL,_wasm::OrderedFixedStorage<wasm::GCData_*,_2UL>,_std::set<wasm::GCData_*,_std::less<wasm::GCData_*>,_std::allocator<wasm::GCData_*>_>_>
        .flexible._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x20) = 0;
      *(size_t *)
       interface.seenDataStack.
       super_SmallSetBase<wasm::GCData_*,_2UL,_wasm::OrderedFixedStorage<wasm::GCData_*,_2UL>,_std::set<wasm::GCData_*,_std::less<wasm::GCData_*>,_std::allocator<wasm::GCData_*>_>_>
       .flexible._M_t._M_impl.super__Rb_tree_header._M_node_count = sVar5;
      *(char **)(interface.seenDataStack.
                 super_SmallSetBase<wasm::GCData_*,_2UL,_wasm::OrderedFixedStorage<wasm::GCData_*,_2UL>,_std::set<wasm::GCData_*,_std::less<wasm::GCData_*>,_std::allocator<wasm::GCData_*>_>_>
                 .flexible._M_t._M_impl.super__Rb_tree_header._M_node_count + 8) = pcVar37;
      *(size_t *)
       (interface.seenDataStack.
        super_SmallSetBase<wasm::GCData_*,_2UL,_wasm::OrderedFixedStorage<wasm::GCData_*,_2UL>,_std::set<wasm::GCData_*,_std::less<wasm::GCData_*>,_std::allocator<wasm::GCData_*>_>_>
        .flexible._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x10) = sVar6;
      *(char **)(interface.seenDataStack.
                 super_SmallSetBase<wasm::GCData_*,_2UL,_wasm::OrderedFixedStorage<wasm::GCData_*,_2UL>,_std::set<wasm::GCData_*,_std::less<wasm::GCData_*>,_std::allocator<wasm::GCData_*>_>_>
                 .flexible._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x18) = pcVar7;
      *(undefined4 *)
       (interface.seenDataStack.
        super_SmallSetBase<wasm::GCData_*,_2UL,_wasm::OrderedFixedStorage<wasm::GCData_*,_2UL>,_std::set<wasm::GCData_*,_std::less<wasm::GCData_*>,_std::allocator<wasm::GCData_*>_>_>
        .flexible._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x20) = 3;
      ::wasm::Module::addExport((unique_ptr *)_Var50._M_head_impl);
      if (interface.seenDataStack.
          super_SmallSetBase<wasm::GCData_*,_2UL,_wasm::OrderedFixedStorage<wasm::GCData_*,_2UL>,_std::set<wasm::GCData_*,_std::less<wasm::GCData_*>,_std::allocator<wasm::GCData_*>_>_>
          .flexible._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
        operator_delete((void *)interface.seenDataStack.
                                super_SmallSetBase<wasm::GCData_*,_2UL,_wasm::OrderedFixedStorage<wasm::GCData_*,_2UL>,_std::set<wasm::GCData_*,_std::less<wasm::GCData_*>,_std::allocator<wasm::GCData_*>_>_>
                                .flexible._M_t._M_impl.super__Rb_tree_header._M_node_count,0x28);
      }
    }
    puVar18 = (pointer)wasm.memories.
                       super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
    _Var19._M_head_impl = local_118._M_head_impl;
  }
  for (; puVar21 != puVar18; puVar21 = puVar21 + 1) {
    _Var8.super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl =
         (puVar21->_M_t).
         super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>.
         _M_t.
         super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>.
         super__Head_base<0UL,_wasm::ElementSegment_*,_false>;
    if ((*(char **)((long)_Var8.super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl +
                   0x20) != (char *)0x0) &&
       (*(char **)((long)_Var8.super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl +
                  0x20) == ((_Var19._M_head_impl)->name).super_IString.str._M_str)) {
      uVar9 = *(uintptr_t *)_Var8.super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl;
      sVar5 = *(size_t *)
               ((long)_Var8.super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl + 8);
      auStack_b28 = (undefined1  [8])operator_new(0x58);
      (((element_type *)((long)auStack_b28 + 0x40))->type).id = 0;
      (((element_type *)((long)auStack_b28 + 0x40))->values).super_SmallVector<wasm::Literal,_1UL>.
      usedFixed = 0;
      (((element_type *)auStack_b28)->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (((element_type *)auStack_b28)->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (((element_type *)auStack_b28)->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems
      [0].type.id = 0;
      (((element_type *)auStack_b28)->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (((element_type *)auStack_b28)->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems
      [0].field_0.i64 = 0;
      *(char **)((long)&(((element_type *)auStack_b28)->values).
                        super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.func.
                        super_IString.str + 8) = (char *)0x0;
      (((element_type *)auStack_b28)->type).id = 0;
      (((element_type *)auStack_b28)->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed = 0;
      (((element_type *)((long)auStack_b28 + 0x40))->type).id = 0x10000;
      *(undefined1 *)
       &(((element_type *)((long)auStack_b28 + 0x40))->values).super_SmallVector<wasm::Literal,_1UL>
        .usedFixed = 0;
      (((element_type *)((long)auStack_b28 + 0x40))->values).super_SmallVector<wasm::Literal,_1UL>.
      fixed._M_elems[0].field_0.i64 = 2;
      (((element_type *)auStack_b28)->type).id = uVar9;
      (((element_type *)auStack_b28)->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed =
           sVar5;
      (((element_type *)auStack_b28)->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (((element_type *)((long)auStack_b28 + 0x40))->type).id = 0x10000;
      *(undefined1 *)
       &(((element_type *)((long)auStack_b28 + 0x40))->values).super_SmallVector<wasm::Literal,_1UL>
        .usedFixed = 0;
      (((element_type *)((long)auStack_b28 + 0x40))->values).super_SmallVector<wasm::Literal,_1UL>.
      fixed._M_elems[0].field_0.i64 = 2;
      (((element_type *)auStack_b28)->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems
      [0].field_0.v128[0] =
           *(uint8_t *)
            ((long)_Var8.super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl + 0x10);
      (((element_type *)auStack_b28)->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           *(pointer *)
            ((long)_Var8.super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl + 0x38);
      (((element_type *)((long)auStack_b28 + 0x40))->type).id =
           *(uintptr_t *)
            ((long)_Var8.super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl + 0x40);
      *(undefined1 *)
       &(((element_type *)((long)auStack_b28 + 0x40))->values).super_SmallVector<wasm::Literal,_1UL>
        .usedFixed = *(undefined1 *)
                      ((long)_Var8.super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl
                      + 0x48);
      (((element_type *)((long)auStack_b28 + 0x40))->values).super_SmallVector<wasm::Literal,_1UL>.
      fixed._M_elems[0].field_0.i64 =
           *(int64_t *)
            ((long)_Var8.super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl + 0x50);
      psVar33 = (size_t *)::wasm::Module::addMemory((unique_ptr *)_Var19._M_head_impl);
      if (auStack_b28 != (undefined1  [8])0x0) {
        operator_delete((void *)auStack_b28,0x58);
      }
      psVar33[5] = 0;
      psVar33[6] = 0;
      psVar33[3] = 0;
      psVar33[4] = 0;
      sVar5 = *(size_t *)
               ((long)_Var8.super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl + 0x28
               );
      sVar6 = *(size_t *)
               ((long)_Var8.super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl + 0x30
               );
      sVar10 = *psVar33;
      sVar11 = psVar33[1];
      auStack_b28 = (undefined1  [8])operator_new(0x28);
      *(size_t *)((long)auStack_b28 + 0x10) = 0;
      *(size_t *)((long)auStack_b28 + 0x18) = 0;
      *(size_t *)auStack_b28 = 0;
      *(size_t *)((long)auStack_b28 + 8) = 0;
      *(size_t *)((long)auStack_b28 + 0x20) = 0;
      *(size_t *)auStack_b28 = sVar5;
      *(size_t *)((long)auStack_b28 + 8) = sVar6;
      *(size_t *)((long)auStack_b28 + 0x10) = sVar10;
      *(size_t *)((long)auStack_b28 + 0x18) = sVar11;
      *(undefined4 *)((long)auStack_b28 + 0x20) = 2;
      ::wasm::Module::addExport((unique_ptr *)_Var19._M_head_impl);
      if (auStack_b28 != (undefined1  [8])0x0) {
        operator_delete((void *)auStack_b28,0x28);
      }
    }
  }
  p_Stack_530 = (_Base_ptr)&p_Stack_540;
  local_538 = (_Base_ptr)0x0;
  local_548 = (_Base_ptr *)0x0;
  p_Stack_540 = (_Base_ptr)0x0;
  auStack_520[0] = '\0';
  auStack_520[1] = '\0';
  auStack_520[2] = '\0';
  auStack_520[3] = '\0';
  auStack_520[4] = '\0';
  auStack_520[5] = '\0';
  auStack_520[6] = '\0';
  auStack_520[7] = '\0';
  p_Var49 = (_Link_type)&local_548;
  local_528 = p_Stack_530;
  anon_unknown.dwarf_4cc93::CtorEvalExternalInterface::CtorEvalExternalInterface
            ((CtorEvalExternalInterface *)
             ((long)&interface.seenDataStack.
                     super_SmallSetBase<wasm::GCData_*,_2UL,_wasm::OrderedFixedStorage<wasm::GCData_*,_2UL>,_std::set<wasm::GCData_*,_std::less<wasm::GCData_*>,_std::allocator<wasm::GCData_*>_>_>
                     .flexible._M_t._M_impl.super__Rb_tree_header + 0x20),
             (map<wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
              *)p_Var49);
  std::
  _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
  ::_M_erase((_Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
              *)local_538,p_Var49);
  _Var50._M_head_impl = local_118._M_head_impl;
  _Stack_228._M_nxt = (_Hash_node_base *)0x0;
  peVar34 = (element_type *)operator_new(0x2d0);
  (peVar34->super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>).
  super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>.module = (Module *)0x100000001
  ;
  (peVar34->super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>).
  super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>._vptr_ExpressionRunner =
       (_func_int **)&PTR___Sp_counted_ptr_inplace_00153be8;
  this_03 = &(peVar34->super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>).
             super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>.maxDepth;
  local_b18._8_8_ = &export_;
  local_b18._M_allocated_capacity = 0;
  auStack_b28 = (undefined1  [8])0x0;
  export_._M_t.super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t.
  super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
  super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl =
       (__uniq_ptr_data<wasm::Export,_std::default_delete<wasm::Export>,_true,_true>)
       (__uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>)0x0;
  local_b08 = (undefined1)local_b18._8_8_;
  uStack_b07 = (undefined7)((ulong)local_b18._8_8_ >> 8);
  _Stack_b00._0_1_ = 0;
  _Stack_b00._1_7_ = 0;
  anon_unknown.dwarf_4cc93::EvallingModuleRunner::EvallingModuleRunner
            ((EvallingModuleRunner *)this_03,_Var50._M_head_impl,
             (ExternalInterface *)
             ((long)&interface.seenDataStack.
                     super_SmallSetBase<wasm::GCData_*,_2UL,_wasm::OrderedFixedStorage<wasm::GCData_*,_2UL>,_std::set<wasm::GCData_*,_std::less<wasm::GCData_*>,_std::allocator<wasm::GCData_*>_>_>
                     .flexible._M_t._M_impl.super__Rb_tree_header + 0x20),
             (map<wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
              *)auStack_b28);
  std::
  _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
  ::_M_erase((_Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
              *)local_b18._M_allocated_capacity,(_Link_type)_Var50._M_head_impl);
  _Var50._M_head_impl = local_118._M_head_impl;
  this_02 = &(local_118._M_head_impl)->name;
  p_Var53 = (_Rb_tree_node_base *)&linkedInstances;
  _Stack_228._M_nxt = (_Hash_node_base *)this_03;
  envInstance.
  super___shared_ptr<(anonymous_namespace)::EvallingModuleRunner,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = peVar34;
  for (p_Var54 = (_Base_ptr)linkedInstances._M_t._M_impl.super__Rb_tree_header._M_header._0_8_;
      p_Var54 != (_Rb_tree_node_base *)0x0; p_Var54 = (&p_Var54->_M_left)[bVar24]) {
    bVar24 = ::wasm::IString::operator<((IString *)(p_Var54 + 1),&this_02->super_IString);
    if (!bVar24) {
      p_Var53 = p_Var54;
    }
  }
  if ((p_Var53 == (_Rb_tree_node_base *)&linkedInstances) ||
     (bVar24 = ::wasm::IString::operator<(&this_02->super_IString,(IString *)(p_Var53 + 1)), bVar24)
     ) {
    this_00 = (_Rb_tree_node_base *)operator_new(0x40);
    p_Var49 = (_Link_type)(this_00 + 1);
    p_Var54 = (_Base_ptr)((_Var50._M_head_impl)->name).super_IString.str._M_str;
    *(size_t *)(this_00 + 1) = (this_02->super_IString).str._M_len;
    this_00[1]._M_parent = p_Var54;
    this_00[1]._M_left = (_Base_ptr)0x0;
    this_00[1]._M_right = (_Base_ptr)0x0;
    if (p_Var53 == (_Rb_tree_node_base *)&linkedInstances) {
      if ((linkedInstances._M_t._M_impl.super__Rb_tree_header._M_header._M_right == (_Base_ptr)0x0)
         || (__p = p_Var49,
            bVar24 = ::wasm::IString::operator<
                               ((IString *)
                                (linkedInstances._M_t._M_impl.super__Rb_tree_header._M_header.
                                 _M_left + 1),(IString *)p_Var49), !bVar24)) {
LAB_0011a489:
        __p = p_Var49;
        pVar62 = std::
                 _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
                 ::_M_get_insert_unique_pos
                           ((_Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
                             *)&local_88,(key_type *)p_Var49);
      }
      else {
LAB_0011a47b:
        auVar13._8_8_ = 0;
        auVar13._0_8_ = linkedInstances._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        pVar62 = (pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*>)(auVar13 << 0x40);
      }
    }
    else {
      other = (_Link_type)(p_Var53 + 1);
      __p = other;
      bVar24 = ::wasm::IString::operator<((IString *)p_Var49,(IString *)other);
      if (bVar24) {
        pVar62.second = linkedInstances._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        pVar62.first = linkedInstances._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        if (linkedInstances._M_t._M_impl.super__Rb_tree_header._M_header._M_parent != p_Var53) {
          p_Var35 = (_Rb_tree_node_base *)std::_Rb_tree_decrement(p_Var53);
          __p = p_Var49;
          bVar24 = ::wasm::IString::operator<((IString *)(p_Var35 + 1),(IString *)p_Var49);
          if (!bVar24) goto LAB_0011a489;
          p_Var14 = p_Var53;
          if (p_Var35->_M_right == (_Base_ptr)0x0) {
            p_Var53 = p_Var35;
            p_Var14 = (_Rb_tree_node_base *)0x0;
          }
          pVar62.second = p_Var53;
          pVar62.first = p_Var14;
        }
      }
      else {
        __p = p_Var49;
        bVar24 = ::wasm::IString::operator<((IString *)other,(IString *)p_Var49);
        if (bVar24) {
          if (linkedInstances._M_t._M_impl.super__Rb_tree_header._M_header._M_left == p_Var53)
          goto LAB_0011a47b;
          p_Var35 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var53);
          __p = (_Link_type)(p_Var35 + 1);
          bVar24 = ::wasm::IString::operator<((IString *)p_Var49,(IString *)__p);
          if (!bVar24) goto LAB_0011a489;
          p_Var14 = p_Var35;
          if (p_Var53->_M_right == (_Base_ptr)0x0) {
            p_Var35 = p_Var53;
            p_Var14 = (_Rb_tree_node_base *)0x0;
          }
          pVar62.second = p_Var35;
          pVar62.first = p_Var14;
        }
        else {
          pVar62.second = (_Rb_tree_node_base *)0x0;
          pVar62.first = p_Var53;
        }
      }
    }
    p_Var35 = pVar62.second;
    p_Var53 = pVar62.first;
    if (p_Var35 == (_Rb_tree_node_base *)0x0) {
      std::
      _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
      ::_M_drop_node((_Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
                      *)this_00,__p);
    }
    else {
      bVar24 = true;
      if ((p_Var53 == (_Rb_tree_node_base *)0x0) &&
         ((_Rb_tree_node_base *)&linkedInstances != p_Var35)) {
        bVar24 = ::wasm::IString::operator<((IString *)p_Var49,(IString *)(p_Var35 + 1));
      }
      std::_Rb_tree_insert_and_rebalance
                (bVar24,this_00,p_Var35,(_Rb_tree_node_base *)&linkedInstances);
      linkedInstances._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           (_Base_ptr)
           ((long)&(linkedInstances._M_t._M_impl.super__Rb_tree_header._M_header._M_right)->_M_color
           + 1);
      p_Var53 = this_00;
    }
  }
  p_Var53[1]._M_left = (_Base_ptr)_Stack_228._M_nxt;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&p_Var53[1]._M_right,
             (__shared_count<(__gnu_cxx::_Lock_policy)2> *)&envInstance);
  std::
  map<wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
  ::map((map<wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
         *)local_578,
        (map<wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
         *)&local_88);
  p_Var49 = (_Link_type)local_578;
  anon_unknown.dwarf_4cc93::CtorEvalExternalInterface::CtorEvalExternalInterface
            ((CtorEvalExternalInterface *)&wasm.tagsMap._M_h._M_single_bucket,
             (map<wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
              *)p_Var49);
  std::
  _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
  ::_M_erase((_Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
              *)local_578._16_8_,p_Var49);
  std::
  map<wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
  ::map((map<wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
         *)&ret.funcEffectsMap.
            super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount,
        (map<wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
         *)&local_88);
  pcVar37 = (char *)&options.enabledFeatures;
  anon_unknown.dwarf_4cc93::EvallingModuleRunner::EvallingModuleRunner
            ((EvallingModuleRunner *)auStack_b28,(Module *)pcVar37,
             (ExternalInterface *)&wasm.tagsMap._M_h._M_single_bucket,
             (map<wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
              *)&ret.funcEffectsMap.
                 super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount);
  std::
  _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
  ::_M_erase((_Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
              *)std::
                _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-ctor-eval.cpp:1007:10)>
                ::_M_manager,(_Link_type)pcVar37);
  local_508 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  arg = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        scope.currDelegateTarget.super_IString.str._M_str;
  if (scope.currDelegateTarget.super_IString.str._M_str != (char *)0x0) {
LAB_0011a587:
    if ((anonymous_namespace)::quiet == 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"trying to eval ",0xf);
      poVar36 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,(arg->_M_dataplus)._M_p,arg->_M_string_length);
      auStack_4f8[0] = 10;
      std::__ostream_insert<char,std::char_traits<char>>(poVar36,auStack_4f8,1);
    }
    pcVar37 = (char *)::wasm::IString::interned(arg->_M_string_length,(arg->_M_dataplus)._M_p,0);
    NVar64.super_IString.str._M_str = pcVar37;
    NVar64.super_IString.str._M_len = (size_t)&options.enabledFeatures;
    lVar38 = ::wasm::Module::getExportOrNull(NVar64);
    if (lVar38 == 0) {
      ::wasm::Fatal::Fatal((Fatal *)auStack_4f8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&reader.skipFunctionBodies,"export not found: ",0x12);
      ::wasm::Fatal::operator<<((Fatal *)auStack_4f8,arg);
      ::wasm::Fatal::~Fatal((Fatal *)auStack_4f8);
    }
    pFVar28 = *(Function **)(lVar38 + 0x10);
    linkedInstances._M_t._M_impl.super__Rb_tree_header._M_node_count = *(size_t *)(lVar38 + 0x18);
    input.field_2._8_8_ = pFVar28;
    auVar63 = ::wasm::IString::interned(arg->_M_string_length,(arg->_M_dataplus)._M_p,0);
    local_510 = auVar63._8_8_;
    pMVar27 = (Module *)CONCAT71(uStack_b07,local_b08);
    NVar55.super_IString.str._M_str = (char *)input.field_2._8_8_;
    NVar55.super_IString.str._M_len = (size_t)pMVar27;
    pcVar37 = (char *)input.field_2._8_8_;
    function = (Function *)::wasm::Module::getFunction(NVar55);
    lVar38 = ::wasm::Function::getNumParams();
    if ((lVar38 == 0) || ((anonymous_namespace)::ignoreExternalInput != '\0')) {
      params.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id = 0;
      params.super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      params.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.i64 = 0;
      params.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.func.super_IString.str.
      _M_str = (char *)0x0;
      auStack_208 = (undefined1  [8])0x0;
      params.super_SmallVector<wasm::Literal,_1UL>.usedFixed = 0;
      params.super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      pFVar39 = (Function *)0x0;
      local_500 = auVar63._0_8_;
      do {
        pFVar28 = pFVar39;
        pFVar39 = (Function *)::wasm::Function::getNumParams();
        iVar48 = (int)pFVar28;
        if (pFVar39 <= pFVar28) {
          pEVar29 = function->body;
          if (pEVar29->_id == BlockId) {
            pFVar28 = (Function *)auStack_b28;
            pcVar37 = (char *)function;
            ::wasm::ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::FunctionScope::
            FunctionScope((FunctionScope *)auStack_308,function,(Literals *)auStack_208,
                          (EvallingModuleRunner *)pFVar28);
            WasmCtorEvalOption.field_2._8_8_ = 0;
            appliedLocals.super__Vector_base<wasm::Literals,_std::allocator<wasm::Literals>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            pCVar44 = (pointer)0x0;
            appliedLocals.super__Vector_base<wasm::Literals,_std::allocator<wasm::Literals>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            results.super_SmallVector<wasm::Literal,_1UL>.flexible.
            super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            results.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id = 0;
            results.super_SmallVector<wasm::Literal,_1UL>.flexible.
            super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            results.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.i64 = 0;
            results.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.func.
            super_IString.str._M_str = (char *)0x0;
            auStack_1c8 = (undefined1  [8])0x0;
            results.super_SmallVector<wasm::Literal,_1UL>.usedFixed = 0;
            uVar9 = pEVar29[2].type.id;
            if (uVar9 == 0) goto LAB_0011ac69;
            pCVar44 = (pointer)0x0;
            uVar40 = 0;
            goto LAB_0011a862;
          }
          local_4d8._0_8_ = (pointer)0x0;
          local_4d8._8_8_ = (pointer)0x0;
          stack0xfffffffffffffb18 = (code *)0x0;
          auStack_4f8 = (undefined1  [8])0x0;
          reader.super_ModuleIOBase.debugInfo = false;
          reader.DWARF = false;
          reader._2_2_ = 0;
          reader.profile = Normal;
          local_4c8 = (pointer)0x0;
          p_Stack_ab8 = (_Base_ptr)0x0;
          if ((pointer)local_aa8._M_nxt != (pointer)CONCAT44(uStack_aac,local_ab0)) {
            local_aa8._M_nxt = (_Hash_node_base *)CONCAT44(uStack_aac,local_ab0);
          }
          arguments = (Literals *)auStack_208;
          name.super_IString.str._M_str =
               (char *)linkedInstances._M_t._M_impl.super__Rb_tree_header._M_node_count;
          name.super_IString.str._M_len = input.field_2._8_8_;
          ::wasm::ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::
          callFunctionInternal
                    ((Literals *)auStack_d8,
                     (ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)auStack_b28,
                     name,arguments);
          auStack_4f8 = auStack_d8;
          ::wasm::Literal::operator=((Literal *)&reader,(Literal *)&localSets);
          pFVar28 = local_a8;
          scope.locals.super__Vector_base<wasm::Literals,_std::allocator<wasm::Literals>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)local_4c8;
          scope.locals.super__Vector_base<wasm::Literals,_std::allocator<wasm::Literals>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)local_4d8._8_8_;
          auStack_308 = (undefined1  [8])local_4d8._0_8_;
          local_4d8._0_8_ = local_b8;
          local_4d8._8_8_ = pLStack_b0;
          local_4c8 = (pointer)local_a8;
          local_b8 = (pointer)0x0;
          pLStack_b0 = (pointer)0x0;
          local_a8 = (Function *)0x0;
          std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
                    ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)auStack_308);
          std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
                    ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)
                     &stack0xffffffffffffff48);
          ::wasm::Literal::~Literal((Literal *)&localSets);
          anon_unknown.dwarf_4cc93::CtorEvalExternalInterface::applyToModule
                    ((CtorEvalExternalInterface *)&wasm.tagsMap._M_h._M_single_bucket);
          pcVar37 = auStack_4f8;
          std::_Optional_payload_base<wasm::Literals>::_Storage<wasm::Literals,false>::
          _Storage<wasm::Literals&>((_Storage<wasm::Literals,false> *)&local_288);
          local_250 = '\x01';
          std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
                    ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)local_4d8);
          ::wasm::Literal::~Literal((Literal *)&reader);
          break;
        }
        pcVar37 = (char *)pFVar28;
        auStack_d8 = (undefined1  [8])::wasm::Function::getLocalType((uint)function);
        cVar23 = ::wasm::Type::isNonNullable();
        if (cVar23 == '\0') {
          cVar23 = ::wasm::Type::isTuple();
          if (cVar23 != '\0') {
            auStack_4f8 = (undefined1  [8])auStack_d8;
            reader.super_ModuleIOBase.debugInfo = false;
            reader.DWARF = false;
            reader._2_2_ = 0;
            reader.profile = Normal;
            uVar40 = ::wasm::Type::size();
            pFVar28 = (Function *)((ulong)auStack_4f8 ^ (ulong)auStack_d8 | reader._0_8_ ^ uVar40);
            pFVar39 = pFVar28;
            while (pFVar39 != (Function *)0x0) {
              plVar41 = (long *)::wasm::Type::Iterator::operator*((Iterator *)auStack_4f8);
              auStack_308 = (undefined1  [8])*plVar41;
              cVar23 = ::wasm::Type::isNonNullable();
              if (cVar23 != '\0') {
                if (pFVar39 != (Function *)0x0) goto LAB_0011a6cb;
                break;
              }
              reader._0_8_ = reader._0_8_ + 1;
              pFVar28 = (Function *)(reader._0_8_ ^ uVar40);
              pFVar39 = (Function *)((ulong)auStack_4f8 ^ (ulong)auStack_d8 | (ulong)pFVar28);
            }
          }
          bVar24 = true;
        }
        else {
LAB_0011a6cb:
          bVar24 = false;
        }
        if (bVar24) {
          ::wasm::Literal::makeZero((Type)auStack_4f8);
          pcVar37 = auStack_4f8;
          ::wasm::SmallVector<wasm::Literal,_1UL>::push_back
                    ((SmallVector<wasm::Literal,_1UL> *)auStack_208,(Literal *)auStack_4f8);
          ::wasm::Literal::~Literal((Literal *)auStack_4f8);
        }
        else {
          if ((anonymous_namespace)::quiet == 0) {
            pcVar37 = "  ...stopping due to non-zeroable param\n";
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"  ...stopping due to non-zeroable param\n",0x28);
          }
          local_250 = '\0';
        }
        pFVar39 = (Function *)(ulong)(iVar48 + 1);
      } while (bVar24);
      goto LAB_0011b02c;
    }
    if ((anonymous_namespace)::quiet == 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"  ...stopping due to params\n",0x1c);
      pcVar37 = "\n       recommendation: consider --ignore-external-input";
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"\n       recommendation: consider --ignore-external-input",
                 0x38);
    }
    local_250 = '\0';
    goto LAB_0011b044;
  }
LAB_0011b2e4:
  ::wasm::ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::~ModuleRunnerBase
            ((ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)auStack_b28);
  wasm.tagsMap._M_h._M_single_bucket = (__node_base_ptr)&PTR__CtorEvalExternalInterface_001539d0;
  std::
  _Rb_tree<wasm::GCData_*,_wasm::GCData_*,_std::_Identity<wasm::GCData_*>,_std::less<wasm::GCData_*>,_std::allocator<wasm::GCData_*>_>
  ::~_Rb_tree((_Rb_tree<wasm::GCData_*,_wasm::GCData_*,_std::_Identity<wasm::GCData_*>,_std::less<wasm::GCData_*>,_std::allocator<wasm::GCData_*>_>
               *)((long)interface.seenDataStack.
                        super_SmallSetBase<wasm::GCData_*,_2UL,_wasm::OrderedFixedStorage<wasm::GCData_*,_2UL>,_std::set<wasm::GCData_*,_std::less<wasm::GCData_*>,_std::allocator<wasm::GCData_*>_>_>
                        .fixed.super_FixedStorageBase<wasm::GCData_*,_2UL>.storage._M_elems + 8));
  std::
  _Hashtable<wasm::GCData_*,_std::pair<wasm::GCData_*const,_wasm::Name>,_std::allocator<std::pair<wasm::GCData_*const,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::GCData_*>,_std::hash<wasm::GCData_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<wasm::GCData_*,_std::pair<wasm::GCData_*const,_wasm::Name>,_std::allocator<std::pair<wasm::GCData_*const,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::GCData_*>,_std::hash<wasm::GCData_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)&interface.usedGlobalNames._M_h._M_single_bucket);
  std::
  _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)&interface.memories._M_h._M_single_bucket);
  std::
  _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::vector<char,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::vector<char,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&interface.linkedInstances._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
  ::_M_erase((_Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
              *)interface.linkedInstances._M_t._M_impl.super__Rb_tree_header._M_header._0_8_,
             (_Link_type)pcVar37);
  if (envInstance.
      super___shared_ptr<(anonymous_namespace)::EvallingModuleRunner,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               envInstance.
               super___shared_ptr<(anonymous_namespace)::EvallingModuleRunner,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr);
  }
  interface.seenDataStack.
  super_SmallSetBase<wasm::GCData_*,_2UL,_wasm::OrderedFixedStorage<wasm::GCData_*,_2UL>,_std::set<wasm::GCData_*,_std::less<wasm::GCData_*>,_std::allocator<wasm::GCData_*>_>_>
  .flexible._M_t._M_impl.super__Rb_tree_header._M_node_count =
       (size_t)&PTR__CtorEvalExternalInterface_001539d0;
  std::
  _Rb_tree<wasm::GCData_*,_wasm::GCData_*,_std::_Identity<wasm::GCData_*>,_std::less<wasm::GCData_*>,_std::allocator<wasm::GCData_*>_>
  ::~_Rb_tree((_Rb_tree<wasm::GCData_*,_wasm::GCData_*,_std::_Identity<wasm::GCData_*>,_std::less<wasm::GCData_*>,_std::allocator<wasm::GCData_*>_>
               *)((long)envInterface.seenDataStack.
                        super_SmallSetBase<wasm::GCData_*,_2UL,_wasm::OrderedFixedStorage<wasm::GCData_*,_2UL>,_std::set<wasm::GCData_*,_std::less<wasm::GCData_*>,_std::allocator<wasm::GCData_*>_>_>
                        .fixed.super_FixedStorageBase<wasm::GCData_*,_2UL>.storage._M_elems + 8));
  std::
  _Hashtable<wasm::GCData_*,_std::pair<wasm::GCData_*const,_wasm::Name>,_std::allocator<std::pair<wasm::GCData_*const,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::GCData_*>,_std::hash<wasm::GCData_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<wasm::GCData_*,_std::pair<wasm::GCData_*const,_wasm::Name>,_std::allocator<std::pair<wasm::GCData_*const,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::GCData_*>,_std::hash<wasm::GCData_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)&envInterface.usedGlobalNames._M_h._M_single_bucket);
  std::
  _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)&envInterface.memories._M_h._M_single_bucket);
  std::
  _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::vector<char,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::vector<char,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&envInterface.linkedInstances._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
  ::_M_erase((_Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
              *)envInterface.linkedInstances._M_t._M_impl.super__Rb_tree_header._M_header._0_8_,
             (_Link_type)pcVar37);
  std::unique_ptr<wasm::Module,_std::default_delete<wasm::Module>_>::~unique_ptr
            ((unique_ptr<wasm::Module,_std::default_delete<wasm::Module>_> *)&local_118);
  std::
  _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
  ::_M_erase((_Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
              *)linkedInstances._M_t._M_impl.super__Rb_tree_header._M_header._0_8_,
             (_Link_type)pcVar37);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)auStack_808);
  cVar23 = ::wasm::WasmValidator::validate((Module *)auStack_b28,(uint)&options.enabledFeatures);
  if (cVar23 != '\0') {
    local_ad0 = (pointer)auStack_aa0;
    auStack_b28 = (undefined1  [8])::wasm::Literal::leSI16x8;
    local_b18._M_allocated_capacity = (size_type)&wasm.typeNames._M_h._M_single_bucket;
    local_b18._8_8_ = (__single_object *)0x0;
    local_b08 = 0;
    uStack_b07 = 0;
    _Stack_b00._0_1_ = 0;
    _Stack_b00._1_7_ = 0;
    _Stack_b00.super__Rb_tree_header._M_header._M_color._0_1_ = _S_red;
    _Stack_b00.super__Rb_tree_header._M_header._M_color._1_2_ = 0x101;
    _Stack_b00.super__Rb_tree_header._M_header._4_4_ = 0;
    _Stack_b00.super__Rb_tree_header._M_header._M_parent._0_4_ = 0;
    _Stack_b00.super__Rb_tree_header._M_header._M_parent._4_4_ = 2;
    _Stack_b00.super__Rb_tree_header._M_header._M_left._0_4_ = ~Normal;
    _Stack_b00.super__Rb_tree_header._M_header._M_left._4_4_ = 0x14;
    _Stack_b00.super__Rb_tree_header._M_header._M_right._0_4_ =
         (uint)_Stack_b00.super__Rb_tree_header._M_header._M_right & 0xffffff00;
    _Stack_b00.super__Rb_tree_header._M_node_count._4_4_ = 0;
    _Stack_b00.super__Rb_tree_header._M_header._M_right._4_4_ = 0;
    _Stack_b00.super__Rb_tree_header._M_node_count._0_4_ = 0;
    local_ac8 = (_Base_ptr)0x1;
    local_ac0._M_t.
    super__Tuple_impl<0UL,_std::vector<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>_*,_std::default_delete<std::vector<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>_>_>
    .
    super__Head_base<0UL,_std::vector<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>_*,_false>
    ._M_head_impl =
         (tuple<std::vector<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>_*,_std::default_delete<std::vector<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>_>_>
          )(_Tuple_impl<0UL,_std::vector<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>_*,_std::default_delete<std::vector<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>_>_>
            )0x0;
    p_Stack_ab8 = (_Base_ptr)0x0;
    local_ab0 = 0x3f800000;
    local_aa8._M_nxt = (_Hash_node_base *)0x0;
    auStack_aa0._0_8_ = (pointer)0x0;
    auStack_aa0._8_8_ = &eStack_a68;
    auStack_aa0._16_8_ = (pointer)0x1;
    auStack_aa0._24_8_ = (_Hash_node_base *)0x0;
    auStack_aa0._32_8_ = (pointer)0x0;
    auStack_aa0._40_4_ = 1.0;
    eStack_a68.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id =
         (uintptr_t)aCStack_a18;
    eStack_a68.values.super_SmallVector<wasm::Literal,_1UL>.usedFixed = 0;
    eStack_a68.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.i64._0_7_ = 0;
    eStack_a68.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0._7_4_ = 0;
    local_a70._M_nxt = (_Hash_node_base *)0x0;
    eStack_a68.type.id = 0;
    eStack_a68.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x1;
    eStack_a68.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    eStack_a68.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_a28 = 1.0;
    local_a20 = 0;
    aCStack_a18[0].name._M_dataplus._M_p = (pointer)0x0;
    export_._M_t.super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t.
    super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
    super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl =
         (__uniq_ptr_data<wasm::Export,_std::default_delete<wasm::Export>,_true,_true>)
         (__uniq_ptr_data<wasm::Export,_std::default_delete<wasm::Export>,_true,_true>)
         &options.enabledFeatures;
    local_658._M_dataplus._M_p = (pointer)&local_658.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_658,"memory-packing","");
    ::wasm::PassRunner::add((PassRunner *)auStack_b28,&local_658);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_658._M_dataplus._M_p != &local_658.field_2) {
      operator_delete(local_658._M_dataplus._M_p,local_658.field_2._M_allocated_capacity + 1);
    }
    local_638._M_dataplus._M_p = (pointer)&local_638.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_638,"remove-unused-names","");
    ::wasm::PassRunner::add((PassRunner *)auStack_b28,&local_638);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_638._M_dataplus._M_p != &local_638.field_2) {
      operator_delete(local_638._M_dataplus._M_p,local_638.field_2._M_allocated_capacity + 1);
    }
    local_618._M_dataplus._M_p = (pointer)&local_618.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_618,"dce","");
    ::wasm::PassRunner::add((PassRunner *)auStack_b28,&local_618);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_618._M_dataplus._M_p != &local_618.field_2) {
      operator_delete(local_618._M_dataplus._M_p,local_618.field_2._M_allocated_capacity + 1);
    }
    local_5f8._M_dataplus._M_p = (pointer)&local_5f8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_5f8,"merge-blocks","");
    ::wasm::PassRunner::add((PassRunner *)auStack_b28,&local_5f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5f8._M_dataplus._M_p != &local_5f8.field_2) {
      operator_delete(local_5f8._M_dataplus._M_p,local_5f8.field_2._M_allocated_capacity + 1);
    }
    local_5d8._M_dataplus._M_p = (pointer)&local_5d8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_5d8,"vacuum","");
    ::wasm::PassRunner::add((PassRunner *)auStack_b28,&local_5d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5d8._M_dataplus._M_p != &local_5d8.field_2) {
      operator_delete(local_5d8._M_dataplus._M_p,local_5d8.field_2._M_allocated_capacity + 1);
    }
    local_5b8._M_dataplus._M_p = (pointer)&local_5b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_5b8,"remove-unused-module-elements","");
    ::wasm::PassRunner::add((PassRunner *)auStack_b28,&local_5b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5b8._M_dataplus._M_p != &local_5b8.field_2) {
      operator_delete(local_5b8._M_dataplus._M_p,local_5b8.field_2._M_allocated_capacity + 1);
    }
    ::wasm::PassRunner::run();
    ::wasm::PassRunner::~PassRunner((PassRunner *)auStack_b28);
LAB_0011b690:
    auStack_b28 = (undefined1  [8])&local_b18;
    std::__cxx11::string::_M_construct<char_const*>((string *)auStack_b28,"output","");
    cVar47 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)&options,(key_type *)auStack_b28);
    if (auStack_b28 != (undefined1  [8])&local_b18) {
      operator_delete((void *)auStack_b28,(ulong)(local_b18._M_allocated_capacity + 1));
    }
    if (cVar47._M_node != (_Base_ptr)&options.field_0x8) {
      if (local_1250[0] == (Options)0x1) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"writing...",10);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
        std::ostream::put(-0x20);
        std::ostream::flush();
      }
      auStack_b28._0_3_ = 0x100;
      local_b18._M_allocated_capacity = 0;
      local_b18._8_8_ = local_b18._8_8_ & 0xffffffffffffff00;
      pp_Var3 = &_Stack_b00.super__Rb_tree_header._M_header._M_parent;
      _Stack_b00._0_1_ = SUB81(pp_Var3,0);
      _Stack_b00._1_7_ = SUB87((ulong)pp_Var3 >> 8,0);
      _Stack_b00.super__Rb_tree_header._M_header._M_color._0_1_ = _S_red;
      _Stack_b00.super__Rb_tree_header._M_header._M_color._1_2_ = _S_red >> 8;
      _Stack_b00.super__Rb_tree_header._M_header._M_color._3_1_ = _S_red >> 0x18;
      _Stack_b00.super__Rb_tree_header._M_header._4_4_ = 0;
      _Stack_b00.super__Rb_tree_header._M_header._M_parent._0_4_ =
           (uint)_Stack_b00.super__Rb_tree_header._M_header._M_parent & 0xffffff00;
      _Stack_b00.super__Rb_tree_header._M_node_count._0_4_ = 0;
      _Stack_b00.super__Rb_tree_header._M_node_count._4_4_ = 0;
      local_ad0 = (pointer)((ulong)local_ad0 & 0xffffffffffffff00);
      auStack_b28[1] = local_3a;
      auStack_b28[0] = local_39[0];
      interface.seenDataStack.
      super_SmallSetBase<wasm::GCData_*,_2UL,_wasm::OrderedFixedStorage<wasm::GCData_*,_2UL>,_std::set<wasm::GCData_*,_std::less<wasm::GCData_*>,_std::allocator<wasm::GCData_*>_>_>
      .flexible._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)&envInterface.wasm;
      export_._M_t.super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t.
      super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
      super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl =
           (__uniq_ptr_data<wasm::Export,_std::default_delete<wasm::Export>,_true,_true>)
           (__uniq_ptr_data<wasm::Export,_std::default_delete<wasm::Export>,_true,_true>)
           ((long)local_b18._M_local_buf + 8);
      _Stack_b00.super__Rb_tree_header._M_header._M_right = (_Base_ptr)&local_ad0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)
                 ((long)&interface.seenDataStack.
                         super_SmallSetBase<wasm::GCData_*,_2UL,_wasm::OrderedFixedStorage<wasm::GCData_*,_2UL>,_std::set<wasm::GCData_*,_std::less<wasm::GCData_*>,_std::allocator<wasm::GCData_*>_>_>
                         .flexible._M_t._M_impl.super__Rb_tree_header + 0x20),"output","");
      pmVar26 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)&options,
                             (key_type *)
                             ((long)&interface.seenDataStack.
                                     super_SmallSetBase<wasm::GCData_*,_2UL,_wasm::OrderedFixedStorage<wasm::GCData_*,_2UL>,_std::set<wasm::GCData_*,_std::less<wasm::GCData_*>,_std::allocator<wasm::GCData_*>_>_>
                                     .flexible._M_t._M_impl.super__Rb_tree_header + 0x20));
      pcVar4 = (pmVar26->_M_dataplus)._M_p;
      local_598[0] = local_588;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_598,pcVar4,pcVar4 + pmVar26->_M_string_length);
      ::wasm::ModuleWriter::write(auStack_b28,&options.enabledFeatures,local_598);
      if (local_598[0] != local_588) {
        operator_delete(local_598[0],local_588[0] + 1);
      }
      if ((Module **)
          interface.seenDataStack.
          super_SmallSetBase<wasm::GCData_*,_2UL,_wasm::OrderedFixedStorage<wasm::GCData_*,_2UL>,_std::set<wasm::GCData_*,_std::less<wasm::GCData_*>,_std::allocator<wasm::GCData_*>_>_>
          .flexible._M_t._M_impl.super__Rb_tree_header._M_node_count != &envInterface.wasm) {
        operator_delete((void *)interface.seenDataStack.
                                super_SmallSetBase<wasm::GCData_*,_2UL,_wasm::OrderedFixedStorage<wasm::GCData_*,_2UL>,_std::set<wasm::GCData_*,_std::less<wasm::GCData_*>,_std::allocator<wasm::GCData_*>_>_>
                                .flexible._M_t._M_impl.super__Rb_tree_header._M_node_count,
                        (ulong)((long)&((envInterface.wasm)->exports).
                                       super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start + 1));
      }
      if (_Stack_b00.super__Rb_tree_header._M_header._M_right != (_Base_ptr)&local_ad0) {
        operator_delete(_Stack_b00.super__Rb_tree_header._M_header._M_right,
                        (ulong)((long)&(((__uniq_ptr_impl<wasm::Tag,_std::default_delete<wasm::Tag>_>
                                          *)&(local_ad0->super_SmallVector<wasm::Literal,_1UL>).
                                             usedFixed)->_M_t).
                                       super__Tuple_impl<0UL,_wasm::Tag_*,_std::default_delete<wasm::Tag>_>
                                       .super__Head_base<0UL,_wasm::Tag_*,_false>._M_head_impl + 1))
        ;
      }
      if ((_Base_ptr *)CONCAT71(_Stack_b00._1_7_,_Stack_b00._0_1_) != pp_Var3) {
        operator_delete((undefined1 *)CONCAT71(_Stack_b00._1_7_,_Stack_b00._0_1_),
                        CONCAT44(_Stack_b00.super__Rb_tree_header._M_header._M_parent._4_4_,
                                 (uint)_Stack_b00.super__Rb_tree_header._M_header._M_parent) + 1);
      }
      if (export_._M_t.super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t.
          super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
          super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl !=
          (__uniq_ptr_data<wasm::Export,_std::default_delete<wasm::Export>,_true,_true>)
          ((long)local_b18._M_local_buf + 8)) {
        operator_delete((void *)export_._M_t.
                                super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>
                                .super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl,
                        (ulong)(local_b18._8_8_ + 1));
      }
    }
    ::wasm::Module::~Module((Module *)&options.enabledFeatures);
    if (local_148._M_nxt != (_Hash_node_base *)&input._M_string_length) {
      operator_delete(local_148._M_nxt,input._M_string_length + 1);
    }
    if (options.passOptions.funcEffectsMap.
        super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 options.passOptions.funcEffectsMap.
                 super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr);
    }
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   *)&options.passOptions.arguments._M_h._M_single_bucket);
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)&options.passOptions.ignoreImplicitTraps);
    ::wasm::Options::~Options((Options *)local_1250);
    if (local_188 != &WasmCtorEvalOption._M_string_length) {
      operator_delete(local_188,WasmCtorEvalOption._M_string_length + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)auStack_2a8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&scope.currDelegateTarget.super_IString.str._M_str);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)auStack_7c8);
    return 0;
  }
  poVar36 = (ostream *)std::operator<<((ostream *)&std::cout,(Module *)&options.enabledFeatures);
  auStack_b28[0] = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar36,auStack_b28,1);
  ::wasm::Fatal::Fatal((Fatal *)auStack_b28);
  ::wasm::Fatal::operator<<((Fatal *)auStack_b28,(char (*) [27])"error in validating output");
LAB_0011c306:
  ::wasm::Fatal::~Fatal((Fatal *)auStack_b28);
  while( true ) {
    local_4c8 = (pointer)0x0;
    HStack_4c0.id = 0;
    local_4d8._0_8_ = (Module *)0x0;
    local_4d8._8_8_ = (Module *)0x0;
    stack0xfffffffffffffb18 = (code *)0x0;
    auStack_4f8 = (undefined1  [8])0x0;
    reader.super_ModuleIOBase.debugInfo = false;
    reader.DWARF = false;
    reader._2_2_ = 0;
    reader.profile = Normal;
    local_4b8 = (_Base_ptr)0x0;
    ::wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::visit
              ((Flow *)auStack_d8,
               (ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner> *)auStack_b28,
               *(Expression **)(*(long *)(pEVar29 + 2) + uVar40 * 8));
    auStack_4f8 = auStack_d8;
    ::wasm::Literal::operator=((Literal *)&reader,(Literal *)&localSets);
    pFVar28 = local_a8;
    local_e8 = local_4c8;
    builder_1.wasm = (Module *)local_4d8._8_8_;
    auStack_f8 = (undefined1  [8])local_4d8._0_8_;
    local_4d8._0_8_ = local_b8;
    local_4d8._8_8_ = pLStack_b0;
    local_4c8 = (pointer)local_a8;
    local_b8 = (pointer)0x0;
    pLStack_b0 = (pointer)0x0;
    local_a8 = (Function *)0x0;
    std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
              ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)auStack_f8);
    HStack_4c0.id = (uintptr_t)local_a0;
    local_4b8 = p_Stack_98;
    std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
              ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)&stack0xffffffffffffff48);
    ::wasm::Literal::~Literal((Literal *)&localSets);
    anon_unknown.dwarf_4cc93::CtorEvalExternalInterface::applyToModule
              ((CtorEvalExternalInterface *)&wasm.tagsMap._M_h._M_single_bucket);
    std::vector<wasm::Literals,_std::allocator<wasm::Literals>_>::operator=
              ((vector<wasm::Literals,_std::allocator<wasm::Literals>_> *)
               ((long)&WasmCtorEvalOption.field_2 + 8),
               (vector<wasm::Literals,_std::allocator<wasm::Literals>_> *)auStack_308);
    auStack_1c8 = auStack_4f8;
    ::wasm::Literal::operator=((Literal *)&results,(Literal *)&reader);
    pcVar37 = local_4d8;
    std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::operator=
              ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)
               &results.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type,
               (vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)pcVar37);
    if (local_4b8 == (_Base_ptr)0x0) {
      uVar51 = (int)pCVar44 + 1;
      bVar24 = false;
    }
    else {
      if ((anonymous_namespace)::quiet == 0) {
        pcVar37 = "  ...stopping in block due to break\n";
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"  ...stopping in block due to break\n",0x24);
      }
      uVar51 = (uint)pEVar29[2].type.id;
      bVar24 = true;
    }
    pCVar44 = (pointer)(ulong)uVar51;
    std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
              ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)local_4d8);
    ::wasm::Literal::~Literal((Literal *)&reader);
    if ((bVar24) || (bVar24 = uVar9 - 1 == uVar40, uVar40 = uVar40 + 1, bVar24)) break;
LAB_0011a862:
    if (pEVar29[2].type.id <= uVar40) goto LAB_0011b954;
  }
LAB_0011ac69:
  iVar48 = (int)pCVar44;
  if ((iVar48 != 0) && (pCVar44 < (pointer)pEVar29[2].type.id)) {
    reader.super_ModuleIOBase.debugInfo = false;
    reader.DWARF = false;
    reader._2_2_ = 0;
    reader.profile = Normal;
    stack0xfffffffffffffb18 =
         std::
         _Function_handler<bool_(wasm::Name),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/ir/names.h:72:11)>
         ::_M_manager;
    root.super_IString.str._M_str = auStack_4f8;
    root.super_IString.str._M_len = linkedInstances._M_t._M_impl.super__Rb_tree_header._M_node_count
    ;
    auStack_4f8 = (undefined1  [8])pMVar27;
    unique0x100076a4 = pCVar44;
    NVar64 = ::wasm::Names::getValidName
                       ((Names *)input.field_2._8_8_,root,(function<bool_(wasm::Name)> *)pFVar28);
    linkedInstances._M_t._M_impl.super__Rb_tree_header._M_node_count =
         NVar64.super_IString.str._M_str;
    if (stack0xfffffffffffffb18 != (code *)0x0) {
      (*stack0xfffffffffffffb18)(auStack_4f8,auStack_4f8,3);
    }
    sVar5 = linkedInstances._M_t._M_impl.super__Rb_tree_header._M_node_count;
    newName.super_IString.str._M_str = (char *)arguments;
    newName.super_IString.str._M_len =
         linkedInstances._M_t._M_impl.super__Rb_tree_header._M_node_count;
    pcVar37 = (char *)::wasm::ModuleUtils::copyFunction
                                ((ModuleUtils *)function,(Function *)pMVar27,
                                 NVar64.super_IString.str._M_len,newName);
    NVar56.super_IString.str._M_str = local_500;
    NVar56.super_IString.str._M_len = (size_t)pMVar27;
    lVar38 = ::wasm::Module::getExport(NVar56);
    *(Module **)(lVar38 + 0x10) = NVar64.super_IString.str._M_len;
    *(size_t *)(lVar38 + 0x18) = sVar5;
    pEVar12 = ((Function *)pcVar37)->body;
    auStack_f8 = (undefined1  [8])pMVar27;
    if (pEVar12->_id != BlockId) {
      __assert_fail("int(_id) == int(T::SpecificId)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm.h"
                    ,0x314,"T *wasm::Expression::cast() [T = wasm::Block]");
    }
    uVar40 = 0;
    do {
      puVar42 = (undefined4 *)
                MixedArena::allocSpace((MixedArena *)((long)auStack_f8 + 0x158),0x10,8);
      *puVar42 = 0x16;
      *(undefined8 *)(puVar42 + 2) = 0;
      if (pEVar12[2].type.id <= uVar40) goto LAB_0011b954;
      *(undefined4 **)(*(long *)(pEVar12 + 2) + uVar40 * 8) = puVar42;
      uVar40 = uVar40 + 1;
    } while (iVar48 + (uint)(iVar48 == 0) != uVar40);
    auStack_d8 = (undefined1  [8])0x0;
    localSets.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    localSets.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    uVar51 = 0;
    while( true ) {
      uVar40 = ::wasm::Function::getNumLocals();
      uVar22 = WasmCtorEvalOption.field_2._8_8_;
      if (uVar40 <= uVar51) break;
      lVar38 = (ulong)uVar51 * 0x38;
      plVar41 = (long *)(WasmCtorEvalOption.field_2._8_8_ + lVar38);
      auStack_4f8 = (undefined1  [8])*plVar41;
      ::wasm::Literal::Literal((Literal *)&reader,(Literal *)(plVar41 + 1));
      std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::vector
                ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)local_4d8,
                 (vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)(uVar22 + lVar38 + 0x20));
      value = anon_unknown.dwarf_4cc93::CtorEvalExternalInterface::getSerialization
                        ((CtorEvalExternalInterface *)&wasm.tagsMap._M_h._M_single_bucket,
                         (Literals *)auStack_4f8,(Name)ZEXT816(0));
      local_248[0]._M_nxt =
           (_Hash_node_base *)::wasm::Builder::makeLocalSet((Builder *)auStack_f8,uVar51,value);
      std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
      emplace_back<wasm::Expression*>
                ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)auStack_d8,
                 (Expression **)local_248);
      std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
                ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)local_4d8);
      ::wasm::Literal::~Literal((Literal *)&reader);
      uVar51 = uVar51 + 1;
    }
    pBVar43 = ::wasm::Builder::
              makeBlock<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_true>
                        ((Builder *)auStack_f8,
                         (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                         auStack_d8);
    if (pEVar12[2].type.id == 0) {
LAB_0011b954:
      __assert_fail("index < usedElements",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/mixed_arena.h"
                    ,0xbc,
                    "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                   );
    }
    **(undefined8 **)(pEVar12 + 2) = pBVar43;
    passes.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_2_ = 0x100;
    passes.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._2_1_ = 1;
    ret.optimizeLevel = 2;
    ret.shrinkLevel = -1;
    ret.inlining.alwaysInlineMaxSize = 0x14;
    ret.inlining.oneCallerInlineMaxSize._0_1_ = 0;
    ret.inlining.partialInliningIfs = 0;
    ret.inlining.flexibleInlineMaxSize = 0;
    ret.inlining.allowFunctionsWithLoops = false;
    ret.inlining._13_3_ = 0;
    ret._32_8_ = &ret.arguments._M_h._M_rehash_policy._M_next_resize;
    ret.arguments._M_h._M_buckets = (__buckets_ptr)0x1;
    ret.arguments._M_h._M_bucket_count = 0;
    ret.arguments._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    ret.arguments._M_h._M_element_count._0_4_ = 0x3f800000;
    ret.arguments._M_h._M_rehash_policy._M_max_load_factor = 0.0;
    ret.arguments._M_h._M_rehash_policy._4_4_ = 0;
    ret.arguments._M_h._M_rehash_policy._M_next_resize = 0;
    ret.arguments._M_h._M_single_bucket =
         (__node_base_ptr)&ret.passesToSkip._M_h._M_rehash_policy._M_next_resize;
    ret.passesToSkip._M_h._M_buckets = (__buckets_ptr)0x1;
    ret.passesToSkip._M_h._M_bucket_count = 0;
    ret.passesToSkip._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    ret.passesToSkip._M_h._M_element_count._0_4_ = 0x3f800000;
    ret.passesToSkip._M_h._M_single_bucket = (__node_base_ptr)0x0;
    ret.funcEffectsMap.
    super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    ret.passesToSkip._M_h._M_rehash_policy._M_max_load_factor = 0.0;
    ret.passesToSkip._M_h._M_rehash_policy._4_4_ = 0;
    ret.passesToSkip._M_h._M_rehash_policy._M_next_resize = 0;
    passes.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 2;
    ret.debug = true;
    ret.validate = false;
    ret.validateGlobally = false;
    ret._3_1_ = 0;
    ::wasm::PassRunner::PassRunner
              ((PassRunner *)auStack_4f8,pMVar27,
               (PassOptions *)
               &passes.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (ret.funcEffectsMap.
        super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 ret.funcEffectsMap.
                 super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr);
    }
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   *)&ret.arguments._M_h._M_single_bucket);
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)&ret.ignoreImplicitTraps);
    ::wasm::PassRunner::addDefaultFunctionOptimizationPasses();
    ::wasm::PassRunner::runOnFunction((Function *)auStack_4f8);
    ::wasm::PassRunner::~PassRunner((PassRunner *)auStack_4f8);
    pCVar44 = stack0xffffffffffffffc8;
    if (auStack_d8 != (undefined1  [8])0x0) {
      pcVar37 = (char *)((long)localSets.
                               super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)auStack_d8);
      operator_delete((void *)auStack_d8,(ulong)pcVar37);
      pCVar44 = stack0xffffffffffffffc8;
    }
  }
  bVar24 = (pointer)pEVar29[2].type.id == pCVar44;
  if (bVar24) {
    pcVar37 = auStack_1c8;
    std::_Optional_payload_base<wasm::Literals>::_Storage<wasm::Literals,false>::
    _Storage<wasm::Literals&>((_Storage<wasm::Literals,false> *)&local_288);
  }
  local_250 = bVar24;
  std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
            ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)
             &results.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type);
  ::wasm::Literal::~Literal((Literal *)&results);
  std::vector<wasm::Literals,_std::allocator<wasm::Literals>_>::~vector
            ((vector<wasm::Literals,_std::allocator<wasm::Literals>_> *)
             ((long)&WasmCtorEvalOption.field_2 + 8));
  *(EvallingModuleRunner **)&((scope.function)->debugLocations)._M_h._M_rehash_policy = scope.parent
  ;
  pFVar28 = (Function *)scope.parent;
  std::vector<wasm::Literals,_std::allocator<wasm::Literals>_>::~vector
            ((vector<wasm::Literals,_std::allocator<wasm::Literals>_> *)auStack_308);
LAB_0011b02c:
  std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
            ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)
             &params.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type);
  ::wasm::Literal::~Literal((Literal *)&params);
LAB_0011b044:
  cVar23 = local_250;
  if (local_250 == '\0') {
    if (((anonymous_namespace)::quiet & 1) == 0) {
      pcVar37 = "  ...stopping\n";
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"  ...stopping\n",0xe);
    }
  }
  else {
    if (((anonymous_namespace)::quiet & 1) == 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"  ...success on ",0x10);
      poVar36 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,(arg->_M_dataplus)._M_p,arg->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar36,".\n",2);
    }
    pcVar37 = (char *)::wasm::IString::interned(arg->_M_string_length,(arg->_M_dataplus)._M_p,0);
    NVar57.super_IString.str._M_str = pcVar37;
    NVar57.super_IString.str._M_len = (size_t)&options.enabledFeatures;
    puVar45 = (uintptr_t *)::wasm::Module::getExport(NVar57);
    cVar46 = std::
             _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
             ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                     *)auStack_808,arg);
    if (cVar46.
        super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
        ._M_cur == (__node_type *)0x0) {
      pcVar37 = (char *)*puVar45;
      NVar59.super_IString.str._M_str = pcVar37;
      NVar59.super_IString.str._M_len = (size_t)&options.enabledFeatures;
      ::wasm::Module::removeExport(NVar59);
    }
    else {
      NVar58.super_IString.str._M_str = (char *)puVar45[2];
      NVar58.super_IString.str._M_len = (size_t)&options.enabledFeatures;
      this_01 = (ModuleUtils *)::wasm::Module::getFunction(NVar58);
      reader.super_ModuleIOBase.debugInfo = false;
      reader.DWARF = false;
      reader._2_2_ = 0;
      reader.profile = Normal;
      stack0xfffffffffffffb18 =
           std::
           _Function_handler<bool_(wasm::Name),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/ir/names.h:72:11)>
           ::_M_manager;
      root_00.super_IString.str._M_str = auStack_4f8;
      root_00.super_IString.str._M_len = *(size_t *)(this_01 + 8);
      auStack_4f8 = (undefined1  [8])&options.enabledFeatures;
      IVar65.str = (string_view)
                   ::wasm::Names::getValidName
                             (*(Names **)this_01,root_00,(function<bool_(wasm::Name)> *)pFVar28);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)stack0xfffffffffffffb18 !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        (*stack0xfffffffffffffb18)(auStack_4f8,auStack_4f8,3);
      }
      newName_00.super_IString.str._M_str = (char *)arguments;
      newName_00.super_IString.str._M_len = (size_t)IVar65.str._M_str;
      pFVar28 = ::wasm::ModuleUtils::copyFunction
                          (this_01,(Function *)&options.enabledFeatures,(Module *)IVar65.str._M_len,
                           newName_00);
      ::wasm::HeapType::getSignature();
      if (extraout_RDX == 0) {
        pEVar29 = (Expression *)
                  MixedArena::allocSpace((MixedArena *)&wasm.typeNames._M_h._M_single_bucket,0x10,8)
        ;
        pEVar29->_id = NopId;
        (pEVar29->type).id = 0;
      }
      else {
        pEVar29 = anon_unknown.dwarf_4cc93::CtorEvalExternalInterface::getSerialization
                            ((CtorEvalExternalInterface *)&wasm.tagsMap._M_h._M_single_bucket,
                             &local_288._M_value,(Name)ZEXT816(0));
      }
      pFVar28->body = pEVar29;
      pcVar37 = (char *)*puVar45;
      NVar60.super_IString.str._M_str = pcVar37;
      NVar60.super_IString.str._M_len = (size_t)&options.enabledFeatures;
      lVar38 = ::wasm::Module::getExport(NVar60);
      ((IString *)(lVar38 + 0x10))->str = IVar65.str;
    }
  }
  std::_Optional_payload_base<wasm::Literals>::_M_reset
            ((_Optional_payload_base<wasm::Literals> *)&local_288._M_value);
  if ((cVar23 == '\0') || (arg = arg + 1, arg == local_508)) goto LAB_0011b2e4;
  goto LAB_0011a587;
}

Assistant:

int main(int argc, const char* argv[]) {
  Name entry;
  std::vector<std::string> passes;
  bool emitBinary = true;
  bool debugInfo = false;
  String::Split ctors;
  String::Split keptExports;

  const std::string WasmCtorEvalOption = "wasm-ctor-eval options";

  ToolOptions options("wasm-ctor-eval", "Execute code at compile time");
  options
    .add("--output",
         "-o",
         "Output file (stdout if not specified)",
         WasmCtorEvalOption,
         Options::Arguments::One,
         [](Options* o, const std::string& argument) {
           o->extra["output"] = argument;
           Colors::setEnabled(false);
         })
    .add("--emit-text",
         "-S",
         "Emit text instead of binary for the output file",
         WasmCtorEvalOption,
         Options::Arguments::Zero,
         [&](Options* o, const std::string& argument) { emitBinary = false; })
    .add("--debuginfo",
         "-g",
         "Emit names section and debug info",
         WasmCtorEvalOption,
         Options::Arguments::Zero,
         [&](Options* o, const std::string& arguments) { debugInfo = true; })
    .add("--ctors",
         "-c",
         "Comma-separated list of global constructor functions to evaluate",
         WasmCtorEvalOption,
         Options::Arguments::One,
         [&](Options* o, const std::string& argument) {
           ctors = String::Split(argument, ",");
         })
    .add(
      "--kept-exports",
      "-ke",
      "Comma-separated list of ctors whose exports we keep around even if we "
      "eval those ctors",
      WasmCtorEvalOption,
      Options::Arguments::One,
      [&](Options* o, const std::string& argument) {
        keptExports = String::Split(argument, ",");
      })
    .add("--ignore-external-input",
         "-ipi",
         "Assumes no env vars are to be read, stdin is empty, etc.",
         WasmCtorEvalOption,
         Options::Arguments::Zero,
         [&](Options* o, const std::string& argument) {
           ignoreExternalInput = true;
         })
    .add("--quiet",
         "-q",
         "Do not emit verbose logging about the eval process",
         WasmCtorEvalOption,
         Options::Arguments::Zero,
         [&](Options* o, const std::string& argument) { quiet = true; })
    .add_positional("INFILE",
                    Options::Arguments::One,
                    [](Options* o, const std::string& argument) {
                      o->extra["infile"] = argument;
                    });
  options.parse(argc, argv);

  auto input(read_file<std::string>(options.extra["infile"], Flags::Text));

  Module wasm;
  options.applyFeatures(wasm);

  {
    if (options.debug) {
      std::cout << "reading...\n";
    }
    ModuleReader reader;
    try {
      reader.read(options.extra["infile"], wasm);
    } catch (ParseException& p) {
      p.dump(std::cout);
      Fatal() << "error in parsing input";
    }
  }

  if (!WasmValidator().validate(wasm)) {
    std::cout << wasm << '\n';
    Fatal() << "error in validating input";
  }

  if (canEval(wasm)) {
    evalCtors(wasm, ctors, keptExports);

    if (!WasmValidator().validate(wasm)) {
      std::cout << wasm << '\n';
      Fatal() << "error in validating output";
    }

    // Do some useful optimizations after the evalling
    {
      PassRunner passRunner(&wasm);
      passRunner.add("memory-packing"); // we flattened it, so re-optimize
      // TODO: just do -Os for the one function
      passRunner.add("remove-unused-names");
      passRunner.add("dce");
      passRunner.add("merge-blocks");
      passRunner.add("vacuum");
      passRunner.add("remove-unused-module-elements");
      passRunner.run();
    }
  }

  if (options.extra.count("output") > 0) {
    if (options.debug) {
      std::cout << "writing..." << std::endl;
    }
    ModuleWriter writer;
    writer.setBinary(emitBinary);
    writer.setDebugInfo(debugInfo);
    writer.write(wasm, options.extra["output"]);
  }
}